

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::NameResolverTest_MultipleFilesEnumEdition2023_Test
::~NameResolverTest_MultipleFilesEnumEdition2023_Test
          (NameResolverTest_MultipleFilesEnumEdition2023_Test *this)

{
  (this->super_NameResolverTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NameResolverTest_018d7a98;
  DescriptorPool::~DescriptorPool(&(this->super_NameResolverTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(NameResolverTest, MultipleFilesEnumEdition2023) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2023";

      package proto2_unittest;

      option java_multiple_files = true;

      enum FooEnum {
        FOO_ENUM_UNSPECIFIED = 0;
      }
                )schema");

  auto enum_descriptor = pool_.FindEnumTypeByName("proto2_unittest.FooEnum");
  ClassNameResolver resolver;

  EXPECT_EQ(resolver.GetClassName(enum_descriptor, /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooEnum");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(enum_descriptor),
            PACKAGE_PREFIX "proto2_unittest.FooEnum");
}